

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O3

int tnt_schema_add_indexes(tnt_schema *schema_obj,tnt_reply *r)

{
  byte bVar1;
  mh_assoc_t *pmVar2;
  undefined8 uVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  byte *pbVar8;
  char *pcVar9;
  void *__dest;
  assoc_val *paVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  assoc_val ***ret;
  assoc_val ***ret_00;
  assoc_val *paVar14;
  assoc_val *ptr;
  uint uVar16;
  ulong uVar17;
  mp_type *key;
  long lVar18;
  undefined8 *ptr_00;
  uint uVar19;
  assoc_val *local_58;
  assoc_val *index_number;
  assoc_val *index_string;
  byte *local_40;
  byte *local_38;
  assoc_val *paVar15;
  
  pmVar2 = schema_obj->space_hash;
  local_40 = (byte *)r->data;
  iVar6 = mp_check((char **)&local_40,r->data_end);
  if (iVar6 != 0) {
    return -1;
  }
  pbVar8 = (byte *)r->data;
  bVar1 = *pbVar8;
  if (mp_type_hint[bVar1] != MP_ARRAY) {
    return -1;
  }
  local_40 = pbVar8 + 1;
  if ((bVar1 & 0x40) == 0) {
    uVar19 = bVar1 & 0xf;
  }
  else if ((bVar1 & 1) == 0) {
    local_40 = pbVar8 + 3;
    uVar19 = (uint)(ushort)(*(ushort *)(pbVar8 + 1) << 8 | *(ushort *)(pbVar8 + 1) >> 8);
  }
  else {
    uVar19 = *(uint *)(pbVar8 + 1);
    uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
    local_40 = pbVar8 + 5;
  }
  if (uVar19 == 0) {
    return 0;
  }
  paVar15 = (assoc_val *)0x0;
  paVar14 = (assoc_val *)0x0;
  do {
    key = (mp_type *)((long)&index_string + 4);
    local_58 = (assoc_val *)0x0;
    index_number = (assoc_val *)0x0;
    local_38 = local_40;
    bVar1 = *local_40;
    ptr_00 = (undefined8 *)0x0;
    ptr = paVar15;
    if (mp_type_hint[bVar1] != MP_ARRAY) goto LAB_00118549;
    if ((bVar1 & 0x40) == 0) {
      pbVar8 = local_40 + 1;
    }
    else {
      pbVar8 = local_40 + (ulong)(bVar1 & 1) * 2 + 3;
    }
    bVar1 = *pbVar8;
    pbVar13 = (byte *)(ulong)bVar1;
    uVar11 = (uint)bVar1;
    local_38 = pbVar8 + 1;
    switch(bVar1) {
    case 0xcc:
      uVar11 = (uint)pbVar8[1];
      local_38 = pbVar8 + 2;
      break;
    case 0xcd:
      local_38 = pbVar8 + 3;
      uVar11 = (uint)(ushort)(*(ushort *)(pbVar8 + 1) << 8 | *(ushort *)(pbVar8 + 1) >> 8);
      break;
    case 0xce:
      uVar11 = *(uint *)(pbVar8 + 1);
      uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      local_38 = pbVar8 + 5;
      break;
    case 0xcf:
      uVar3 = *(undefined8 *)(pbVar8 + 1);
      uVar11 = (uint)(byte)((ulong)uVar3 >> 0x38) | ((uint)((ulong)uVar3 >> 0x20) & 0xff0000) >> 8 |
               (uint)((ulong)uVar3 >> 0x18) & 0xff0000 | (uint)((ulong)uVar3 >> 8) & 0xff000000;
      local_38 = pbVar8 + 9;
      break;
    default:
      if (-1 < (char)bVar1) break;
      tnt_schema_add_indexes_cold_2();
      goto LAB_0011861c;
    }
    pbVar8 = local_38;
    index_string._4_4_ = uVar11;
    if (mp_type_hint[*local_38] != MP_UINT) {
LAB_00118546:
      ptr_00 = (undefined8 *)0x0;
      ptr = paVar14;
LAB_00118549:
      pbVar13 = local_40;
      key = (mp_type *)0x1;
      goto LAB_00118559;
    }
    uVar19 = uVar19 - 1;
    uVar7 = PMurHash32(0xd,key,4);
    uVar11 = pmVar2->n_buckets;
    uVar17 = (ulong)uVar7 % (ulong)uVar11;
    while( true ) {
      uVar16 = (uint)uVar17;
      if ((((pmVar2->b[uVar17 >> 4] >> (uVar16 & 0xf) & 1) != 0) &&
          (paVar10 = pmVar2->p[uVar17], (paVar10->key).id_len == 4)) &&
         (index_string._4_4_ == *(uint *)(paVar10->key).id)) break;
      if (((pmVar2->b[uVar17 >> 4] >> (sbyte)(uVar16 & 0xf)) >> 0x10 & 1) == 0) {
        return -1;
      }
      uVar16 = uVar16 + uVar7 % (uVar11 - 1) + 1;
      uVar12 = uVar11;
      if (uVar16 < uVar11) {
        uVar12 = 0;
      }
      uVar17 = (ulong)(uVar16 - uVar12);
    }
    if (uVar16 == uVar11) {
      return -1;
    }
    pvVar4 = paVar10->data;
    ptr_00 = (undefined8 *)tnt_mem_alloc(0x10);
    if (ptr_00 == (undefined8 *)0x0) goto LAB_00118546;
    *ptr_00 = 0;
    ptr_00[1] = 0;
    bVar1 = *pbVar8;
    uVar11 = (uint)bVar1;
    key = mp_type_hint;
    if (mp_type_hint[bVar1] != MP_UINT) goto LAB_00118549;
    pbVar13 = pbVar8 + 1;
    switch(bVar1) {
    case 0xcc:
      uVar11 = (uint)pbVar8[1];
      local_38 = pbVar8 + 2;
      break;
    case 0xcd:
      local_38 = pbVar8 + 3;
      uVar11 = (uint)(ushort)(*(ushort *)(pbVar8 + 1) << 8 | *(ushort *)(pbVar8 + 1) >> 8);
      break;
    case 0xce:
      uVar11 = *(uint *)(pbVar8 + 1);
      uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      local_38 = pbVar8 + 5;
      break;
    case 0xcf:
      uVar3 = *(undefined8 *)(pbVar8 + 1);
      uVar11 = (uint)(byte)((ulong)uVar3 >> 0x38) | ((uint)((ulong)uVar3 >> 0x20) & 0xff0000) >> 8 |
               (uint)((ulong)uVar3 >> 0x18) & 0xff0000 | (uint)((ulong)uVar3 >> 8) & 0xff000000;
      local_38 = pbVar8 + 9;
      break;
    default:
      local_38 = pbVar13;
      if ((char)bVar1 < '\0') {
LAB_0011861c:
        tnt_schema_add_indexes_cold_1();
        goto LAB_00118621;
      }
    }
    *(uint *)((long)ptr_00 + 0xc) = uVar11;
    if (mp_type_hint[*local_38] != MP_STR) goto LAB_00118549;
    pcVar9 = mp_decode_str((char **)&local_38,(uint32_t *)(ptr_00 + 1));
    __dest = tnt_mem_alloc((ulong)*(uint *)(ptr_00 + 1));
    *ptr_00 = __dest;
    ptr = paVar14;
    if (__dest == (void *)0x0) goto LAB_00118549;
    memcpy(__dest,pcVar9,(ulong)*(uint *)(ptr_00 + 1));
    paVar10 = (assoc_val *)tnt_mem_alloc(0x18);
    index_number = paVar10;
    if (paVar10 == (assoc_val *)0x0) goto LAB_00118549;
    (paVar10->key).id = (char *)*ptr_00;
    (paVar10->key).id_len = *(uint32_t *)(ptr_00 + 1);
    paVar10->data = ptr_00;
    local_58 = (assoc_val *)tnt_mem_alloc(0x18);
    if (local_58 == (assoc_val *)0x0) {
      local_58 = (assoc_val *)0x0;
      ptr = paVar10;
      goto LAB_00118549;
    }
    pcVar9 = (char *)((long)ptr_00 + 0xc);
    (local_58->key).id = pcVar9;
    (local_58->key).id_len = 4;
    local_58->data = ptr_00;
    mh_assoc_put(*(mh_assoc_t **)((long)pvVar4 + 0x10),&index_number,ret,pcVar9);
    mh_assoc_put(*(mh_assoc_t **)((long)pvVar4 + 0x10),&local_58,ret_00,pcVar9);
    mp_next((char **)&local_40);
    if (uVar19 == 0) {
      return 0;
    }
  } while( true );
LAB_00118621:
  local_40 = pbVar13;
  mp_next_slowpath((char **)&local_40,(int64_t)key);
  goto LAB_001185a6;
  while (bVar5 = 1 < (long)key, pbVar13 = local_40, key = (mp_type *)((long)key + -1), bVar5) {
LAB_00118559:
    local_40 = pbVar13 + 1;
    lVar18 = (long)""[*pbVar13];
    if (lVar18 < 0) {
      if (*pbVar13 == 0xd9) {
        local_40 = pbVar13 + (ulong)pbVar13[1] + 2;
      }
      else {
        if ((byte)""[*pbVar13] < 0xe1) goto LAB_00118621;
        key = (mp_type *)((long)key - lVar18);
      }
    }
    else {
      local_40 = local_40 + lVar18;
    }
  }
LAB_001185a6:
  if (ptr != (assoc_val *)0x0) {
    tnt_mem_free(ptr);
  }
  if (ptr_00 != (undefined8 *)0x0) {
    tnt_mem_free((void *)*ptr_00);
  }
  tnt_mem_free(ptr_00);
  return -1;
}

Assistant:

int tnt_schema_add_indexes(struct tnt_schema *schema_obj, struct tnt_reply *r) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	const char *tuple = r->data;
	if (mp_check(&tuple, tuple + (r->data_end - r->data)))
		return -1;
	tuple = r->data;
	if (mp_typeof(*tuple) != MP_ARRAY)
		return -1;
	uint32_t space_count = mp_decode_array(&tuple);
	while (space_count-- > 0) {
		if (tnt_schema_add_index(schema, &tuple))
			return -1;
	}
	return 0;
}